

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O0

void __thiscall Shell::EqualityProxy::addCongruenceAxioms(EqualityProxy *this,UnitList **units)

{
  TermList sort;
  TermList arg0;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Symbol *pSVar4;
  Clause *cl_1;
  uint arity_1;
  Symbol *predSym;
  uint i_1;
  uint preds;
  Clause *cl;
  Term *t2;
  Term *t1;
  OperatorType *fnType;
  uint arity;
  Symbol *fnSym;
  uint i;
  uint funs;
  TermList srt;
  LiteralStack lits;
  Stack<Kernel::TermList> vars2;
  Stack<Kernel::TermList> vars1;
  Clause *in_stack_fffffffffffffe28;
  Signature *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Symbol *in_stack_fffffffffffffe40;
  EqualityProxy *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  TermList in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe70;
  undefined1 polarity;
  Symbol *pSVar5;
  LiteralStack *in_stack_fffffffffffffe98;
  Term *in_stack_fffffffffffffea0;
  Term *in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  Stack<Kernel::TermList> *in_stack_fffffffffffffec8;
  LiteralStack *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  uint local_e0;
  uint local_90;
  TermList local_88 [7];
  Stack<Kernel::TermList> local_50;
  Stack<Kernel::TermList> local_30;
  
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Lib::Stack<Kernel::Literal_*>::Stack
            ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Kernel::TermList::TermList(local_88);
  uVar2 = Kernel::Signature::functions((Signature *)0xb8f1a9);
  for (local_90 = 0; local_90 < uVar2; local_90 = local_90 + 1) {
    pSVar4 = Kernel::Signature::getFunction
                       (in_stack_fffffffffffffe30,(uint)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    pSVar5 = pSVar4;
    in_stack_fffffffffffffee4 = Kernel::Signature::Symbol::usageCnt(pSVar4);
    if (in_stack_fffffffffffffee4 != 0) {
      bVar1 = Kernel::Signature::Symbol::skipCongruence(pSVar4);
      in_stack_fffffffffffffee0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee0);
      if (!bVar1) {
        uVar3 = Kernel::Signature::Symbol::arity(pSVar4);
        in_stack_fffffffffffffedc = uVar3;
        in_stack_fffffffffffffed0 =
             (LiteralStack *)Kernel::Signature::Symbol::fnType(in_stack_fffffffffffffe40);
        if (uVar3 != 0) {
          getArgumentEqualityLiterals
                    ((EqualityProxy *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (Stack<Kernel::TermList> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (OperatorType *)in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffec0 = local_90;
          in_stack_fffffffffffffec8 =
               (Stack<Kernel::TermList> *)Lib::Stack<Kernel::TermList>::begin(&local_30);
          in_stack_fffffffffffffeb8 =
               Kernel::Term::create
                         ((uint)((ulong)pSVar5 >> 0x20),(uint)pSVar5,
                          (TermList *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
          ;
          Lib::Stack<Kernel::TermList>::begin(&local_50);
          in_stack_fffffffffffffea0 =
               Kernel::Term::create
                         ((uint)((ulong)pSVar5 >> 0x20),(uint)pSVar5,
                          (TermList *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
          ;
          Kernel::SortHelper::tryGetResultSort
                    ((Term *)in_stack_fffffffffffffe30,(TermList *)in_stack_fffffffffffffe28);
          Kernel::TermList::TermList
                    ((TermList *)in_stack_fffffffffffffe30,(Term *)in_stack_fffffffffffffe28);
          Kernel::TermList::TermList
                    ((TermList *)in_stack_fffffffffffffe30,(Term *)in_stack_fffffffffffffe28);
          arg0._content._4_4_ = in_stack_fffffffffffffe64;
          arg0._content._0_4_ = in_stack_fffffffffffffe60;
          sort._content._4_4_ = in_stack_fffffffffffffe54;
          sort._content._0_4_ = in_stack_fffffffffffffe50;
          in_stack_fffffffffffffe98 =
               (LiteralStack *)
               makeProxyLiteral(in_stack_fffffffffffffe48,
                                SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0),arg0,
                                in_stack_fffffffffffffe58,sort);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30,
                     (Literal *)in_stack_fffffffffffffe28);
          createEqProxyAxiom((EqualityProxy *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          Lib::List<Kernel::Unit_*>::push
                    ((Unit *)in_stack_fffffffffffffe30,
                     (List<Kernel::Unit_*> **)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffec4 = uVar3;
        }
      }
    }
  }
  uVar2 = Kernel::Signature::predicates((Signature *)0xb8f50e);
  for (local_e0 = 1; local_e0 < uVar2; local_e0 = local_e0 + 1) {
    pSVar4 = Kernel::Signature::getPredicate
                       (in_stack_fffffffffffffe30,(uint)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    pSVar5 = pSVar4;
    uVar3 = Kernel::Signature::Symbol::usageCnt(pSVar4);
    if (uVar3 != 0) {
      bVar1 = Kernel::Signature::Symbol::skipCongruence(pSVar4);
      polarity = (undefined1)(uVar3 >> 0x18);
      if ((!bVar1) && (uVar3 = Kernel::Signature::Symbol::arity(pSVar4), uVar3 != 0)) {
        Kernel::Signature::Symbol::predType(in_stack_fffffffffffffe40);
        getArgumentEqualityLiterals
                  ((EqualityProxy *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (Stack<Kernel::TermList> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (OperatorType *)in_stack_fffffffffffffeb8);
        Lib::Stack<Kernel::TermList>::begin(&local_30);
        Kernel::Literal::create
                  ((uint)((ulong)pSVar5 >> 0x20),(uint)pSVar5,(bool)polarity,
                   (TermList *)CONCAT44(uVar3,in_stack_fffffffffffffe70));
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30,
                   (Literal *)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe40 = (Symbol *)Lib::Stack<Kernel::TermList>::begin(&local_50);
        in_stack_fffffffffffffe30 =
             (Signature *)
             Kernel::Literal::create
                       ((uint)((ulong)pSVar5 >> 0x20),(uint)pSVar5,(bool)polarity,
                        (TermList *)CONCAT44(uVar3,in_stack_fffffffffffffe70));
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30,
                   (Literal *)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe28 =
             createEqProxyAxiom((EqualityProxy *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                               );
        Lib::List<Kernel::Unit_*>::push
                  ((Unit *)in_stack_fffffffffffffe30,
                   (List<Kernel::Unit_*> **)in_stack_fffffffffffffe28);
      }
    }
  }
  Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30);
  Lib::Stack<Kernel::TermList>::~Stack(&in_stack_fffffffffffffe30->_dividesNvalues);
  Lib::Stack<Kernel::TermList>::~Stack(&in_stack_fffffffffffffe30->_dividesNvalues);
  return;
}

Assistant:

void EqualityProxy::addCongruenceAxioms(UnitList*& units)
{
  // This is Krystof Hoder's comment:
  // TODO: skip UPDR predicates!!!
  Stack<TermList> vars1;
  Stack<TermList> vars2;
  LiteralStack lits;
  TermList srt;

  unsigned funs = env.signature->functions();
  for (unsigned i=0; i<funs; i++) {
    Signature::Symbol* fnSym = env.signature->getFunction(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!fnSym->usageCnt() || fnSym->skipCongruence())
      continue;
    unsigned arity = fnSym->arity();
    OperatorType* fnType = fnSym->fnType();
    if (arity == 0) {
      continue;
    }
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, fnType);
    Term* t1 = Term::create(i, arity, vars1.begin());
    Term* t2 = Term::create(i, arity, vars2.begin());
    SortHelper::tryGetResultSort(t1, srt);
    lits.push(makeProxyLiteral(true, TermList(t1), TermList(t2), srt));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }

  unsigned preds = env.signature->predicates();
  for (unsigned i = 1; i < preds; i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!predSym->usageCnt() || predSym->skipCongruence())
      continue;
    unsigned arity = predSym->arity();
    if (arity == 0) {
      continue;
    }
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, predSym->predType());
    lits.push(Literal::create(i, arity, false, vars1.begin()));
    lits.push(Literal::create(i, arity, true, vars2.begin()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }
}